

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O1

void stair_shuffle(dw_rom *rom)

{
  dungeon_map *pdVar1;
  uint8_t uVar2;
  dw_warp *pdVar3;
  dw_map_meta *pdVar4;
  dw_warp *pdVar5;
  dw_dungeon_tile dVar6;
  dungeon_map *pdVar7;
  dw_warp *pdVar8;
  uint8_t uVar9;
  uint8_t (*pauVar10) [30];
  size_t i;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t (*pauVar14) [30];
  dungeon_map *pdVar15;
  dw_warp *pdVar16;
  long lVar17;
  long lVar18;
  dw_map_index dVar19;
  dungeon_map *pdVar20;
  size_t j;
  byte *pbVar21;
  ulong uVar22;
  uint8_t (*local_50) [30];
  
  pdVar7 = (dungeon_map *)calloc(0x11,0x387);
  maps = pdVar7;
  pdVar8 = (dw_warp *)calloc(0x50,3);
  warps_to = pdVar8 + 0xf;
  pdVar3 = (rom->map).warps_from;
  uVar13 = 0;
  lVar11 = 0;
  warps_from = pdVar8;
LAB_001689ed:
  dVar19 = CHARLOCK;
  lVar18 = 0;
  do {
    if (dVar19 == pdVar3[uVar13 % 0x33].map) {
      dVar19 = CHARLOCK;
      lVar18 = 0;
      goto LAB_00168a3a;
    }
    dVar19 = indexes[lVar18 + 1];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x10);
  goto LAB_00168a6c;
  while( true ) {
    dVar19 = indexes[lVar18 + 1];
    lVar18 = lVar18 + 1;
    if (lVar18 == 0x10) break;
LAB_00168a3a:
    if (dVar19 == (rom->map).warps_to[uVar13 % 0x33].map) {
      pdVar8[lVar11].y = pdVar3[uVar13].y;
      uVar9 = pdVar3[uVar13].x;
      pdVar8[lVar11].map = pdVar3[uVar13].map;
      pdVar8[lVar11].x = uVar9;
      lVar11 = lVar11 + 1;
      break;
    }
  }
LAB_00168a6c:
  if (uVar13 == 0x33) {
    warps_to = pdVar8 + lVar11;
  }
  uVar13 = uVar13 + 1;
  if (uVar13 == 0x66) goto code_r0x00168a8d;
  goto LAB_001689ed;
LAB_00168c85:
  pdVar20 = (dungeon_map *)0x0;
LAB_00168c92:
  do {
    do {
      clear_all_flags();
      mt_shuffle(warps_from,((long)warps_to - (long)warps_from) * 0x5555555555555556,3);
      uVar9 = maps->index;
      pdVar15 = maps;
      while (uVar9 != '\0') {
        if (uVar9 == '\x18') goto LAB_00168cd8;
        pdVar1 = pdVar15 + 1;
        pdVar15 = pdVar15 + 1;
        uVar9 = pdVar1->index;
      }
      pdVar15 = (dungeon_map *)0x0;
LAB_00168cd8:
      map_dungeon(pdVar15,'\x06','\v',TRUE);
      uVar9 = maps->index;
      pdVar15 = maps;
      while (uVar9 != '\0') {
        if (uVar9 == '\x16') goto LAB_00168d0e;
        pdVar1 = pdVar15 + 1;
        pdVar15 = pdVar15 + 1;
        uVar9 = pdVar1->index;
      }
      pdVar15 = (dungeon_map *)0x0;
LAB_00168d0e:
      map_dungeon(pdVar15,'\x06','\x05',TRUE);
      uVar9 = maps->index;
      pdVar15 = maps;
      while (uVar9 != '\0') {
        if (uVar9 == '\x1c') goto LAB_00168d44;
        pdVar1 = pdVar15 + 1;
        pdVar15 = pdVar15 + 1;
        uVar9 = pdVar1->index;
      }
      pdVar15 = (dungeon_map *)0x0;
LAB_00168d44:
      map_dungeon(pdVar15,'\0','\0',TRUE);
    } while (((rom->flags[7] & 3) == 0) &&
            (((pdVar7->tiles[10][0x13] | pdVar20->tiles[10][0x1d]) & 8) != 0));
    uVar9 = maps->index;
    pdVar15 = maps;
    while (uVar9 != '\0') {
      if (uVar9 == '\x06') goto LAB_00168d91;
      pdVar1 = pdVar15 + 1;
      pdVar15 = pdVar15 + 1;
      uVar9 = pdVar1->index;
    }
    pdVar15 = (dungeon_map *)0x0;
LAB_00168d91:
    map_dungeon(pdVar15,'\n','\x1d',TRUE);
    pauVar10 = maps->tiles;
    lVar11 = 0;
    do {
      uVar13 = (ulong)maps[lVar11].width;
      if (uVar13 != 0) {
        uVar22 = 0;
        pauVar14 = pauVar10;
        do {
          uVar12 = 0;
          do {
            if ((*pauVar14)[uVar12] == '\x04') goto LAB_00168c92;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
          uVar22 = uVar22 + 1;
          pauVar14 = pauVar14 + 1;
        } while (uVar22 != uVar13);
      }
      lVar11 = lVar11 + 1;
      pauVar10 = (uint8_t (*) [30])((long)(pauVar10 + 0x1e) + 3);
    } while (lVar11 != 0x10);
    if ((rom->flags[7] & 3) != 0) break;
    clear_all_flags();
    map_dungeon(pdVar7,'\n','\x13',TRUE);
  } while ((pdVar20->tiles[10][0x1d] & 8) == 0);
  lVar18 = 0;
  vpatch(rom,0xd95e,3,0x20,0xb5,0xda);
  vpatch(rom,0xd9be,9,0xf0,7,0xc9,3,0xf0,3,0x4c,0xc6,0xda);
  vpatch(rom,0xda06,0xb,0x4c,0x3d,0xd9,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff);
  vpatch(rom,0xdaa5,0x3e,0xc9,6,0xf0,4,0xc9,0xf,0x90,0xa8,0xae,0x2f,0x66,0xa9,2,0x4c,0xe2,0xd9,0xa5,
         0x45,0xc9,2,0xf0,7,0xc9,0xf,0xb0,3,0x8e,0x2f,0x66,0xbd,0x61,0xf4,0x60,0x20,0xf0,0xc6,2,0x20
         ,0xcb,199,0xd,0x4c,0xd9,0xcf,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,
         0xff,0xff,0xff,0xff,0xff,0xff);
  pdVar8 = warps_to;
  pdVar3 = warps_from;
  lVar11 = 0;
LAB_00169019:
  pdVar5 = (rom->map).warps_from;
  pdVar16 = pdVar5 + lVar11;
  dVar19 = CHARLOCK;
  lVar17 = 0;
  do {
    if (dVar19 == pdVar5[lVar11].map) {
      dVar19 = CHARLOCK;
      lVar17 = 0;
      goto LAB_0016905f;
    }
    dVar19 = indexes[lVar17 + 1];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x10);
  goto LAB_001690a8;
  while( true ) {
    dVar19 = indexes[lVar17 + 1];
    lVar17 = lVar17 + 1;
    if (lVar17 == 0x10) break;
LAB_0016905f:
    if (dVar19 == (rom->map).warps_to[lVar11].map) {
      pdVar16->y = pdVar3[lVar18].y;
      pdVar5 = pdVar3 + lVar18;
      uVar9 = pdVar5->x;
      pdVar16->map = pdVar5->map;
      pdVar16->x = uVar9;
      pdVar16 = (rom->map).warps_to;
      pdVar16[lVar11].y = pdVar8[lVar18].y;
      pdVar5 = pdVar8 + lVar18;
      uVar9 = pdVar5->x;
      pdVar16 = pdVar16 + lVar11;
      pdVar16->map = pdVar5->map;
      pdVar16->x = uVar9;
      lVar18 = lVar18 + 1;
      break;
    }
  }
LAB_001690a8:
  lVar11 = lVar11 + 1;
  if (lVar11 == 0x33) goto LAB_001690b5;
  goto LAB_00169019;
code_r0x00168a8d:
  pdVar4 = (rom->map).meta;
  local_50 = pdVar7->tiles + 1;
  uVar13 = 0;
  do {
    dVar19 = indexes[uVar13];
    pdVar7[uVar13].index = (byte)dVar19;
    pdVar7[uVar13].width = pdVar4[dVar19].width + '\x01';
    uVar9 = pdVar4[dVar19].height + '\x01';
    pdVar7[uVar13].height = uVar9;
    if (uVar13 < 2) {
      if (uVar9 != '\0') {
        pbVar21 = rom->content + (*(ushort *)pdVar4[(byte)dVar19].pointer & 0x7fff);
        uVar22 = 0;
        pauVar10 = local_50;
        do {
          if (pdVar7[uVar13].width != '\0') {
            uVar12 = 0;
            pauVar14 = pauVar10;
            do {
              dVar6 = translate_town_tile((uint)(*pbVar21 >> 4));
              pauVar14[-1][0] = (uint8_t)dVar6;
              dVar6 = translate_town_tile(*pbVar21 & TOWN_TILE_COUNTER);
              (*pauVar14)[0] = (uint8_t)dVar6;
              pbVar21 = pbVar21 + 1;
              uVar12 = uVar12 + 2;
              pauVar14 = pauVar14 + 2;
            } while (uVar12 < pdVar7[uVar13].width);
          }
          uVar22 = uVar22 + 1;
          pauVar10 = (uint8_t (*) [30])(*pauVar10 + 1);
        } while (uVar22 < pdVar7[uVar13].height);
      }
    }
    else if (uVar9 != '\0') {
      pbVar21 = rom->content + (*(ushort *)pdVar4[dVar19 & 0xff].pointer & 0x7fff);
      uVar22 = 0;
      pauVar10 = local_50;
      do {
        if (pdVar7[uVar13].width != '\0') {
          uVar12 = 0;
          pauVar14 = pauVar10;
          do {
            pauVar14[-1][0] = *pbVar21 >> 4 & 7;
            (*pauVar14)[0] = *pbVar21 & 7;
            pbVar21 = pbVar21 + 1;
            uVar12 = uVar12 + 2;
            pauVar14 = pauVar14 + 2;
          } while (uVar12 < pdVar7[uVar13].width);
        }
        uVar22 = uVar22 + 1;
        pauVar10 = (uint8_t (*) [30])(*pauVar10 + 1);
      } while (uVar22 < pdVar7[uVar13].height);
    }
    uVar13 = uVar13 + 1;
    local_50 = (uint8_t (*) [30])((long)(local_50 + 0x1e) + 3);
  } while (uVar13 != 0x10);
  rom->chest_access[0xf] = '\0';
  rom->chest_access[0x10] = '\0';
  rom->chest_access[0x11] = '\0';
  rom->chest_access[0x12] = '\0';
  rom->chest_access[0x13] = '\0';
  rom->chest_access[0x14] = '\0';
  rom->chest_access[0x15] = '\0';
  rom->chest_access[0x16] = '\0';
  rom->chest_access[0x17] = '\0';
  rom->chest_access[0x18] = '\0';
  rom->chest_access[0x19] = '\0';
  rom->chest_access[0x1a] = '\0';
  rom->chest_access[0x1b] = '\0';
  rom->chest_access[0x1c] = '\0';
  rom->chest_access[0x1d] = '\0';
  rom->chest_access[0x1e] = '\0';
  rom->chest_access[0] = '\0';
  rom->chest_access[1] = '\0';
  rom->chest_access[2] = '\0';
  rom->chest_access[3] = '\0';
  rom->chest_access[4] = '\0';
  rom->chest_access[5] = '\0';
  rom->chest_access[6] = '\0';
  rom->chest_access[7] = '\0';
  rom->chest_access[8] = '\0';
  rom->chest_access[9] = '\0';
  rom->chest_access[10] = '\0';
  rom->chest_access[0xb] = '\0';
  rom->chest_access[0xc] = '\0';
  rom->chest_access[0xd] = '\0';
  rom->chest_access[0xe] = '\0';
  rom->chest_access[0xf] = '\0';
  (rom->map).key_access = '\0';
  if ((rom->flags[2] & 0xc) != 0) {
    puts("Shuffling stairs...");
    uVar9 = maps->index;
    uVar2 = uVar9;
    pdVar7 = maps;
    while (pdVar20 = maps, uVar2 != '\0') {
      if (uVar2 == '\x02') goto LAB_00168c6c;
      pdVar20 = pdVar7 + 1;
      pdVar7 = pdVar7 + 1;
      uVar2 = pdVar20->index;
    }
    pdVar7 = (dungeon_map *)0x0;
LAB_00168c6c:
    do {
      if (uVar9 == '\0') goto LAB_00168c85;
      if (uVar9 == '\x06') goto LAB_00168c92;
      uVar9 = pdVar20[1].index;
      pdVar20 = pdVar20 + 1;
    } while( true );
  }
LAB_001690b5:
  puts("Mapping Dungeons...");
  pdVar7 = maps;
  clear_all_flags();
  uVar9 = pdVar7->index;
  while (uVar9 != '\0') {
    if (uVar9 == '\x1c') goto LAB_001690eb;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_001690eb:
  map_dungeon(pdVar7,'\0','\0',FALSE);
  mark_chests(rom,'\x01');
  clear_all_flags();
  uVar9 = maps->index;
  pdVar7 = maps;
  while (uVar9 != '\0') {
    if (uVar9 == '\x1c') goto LAB_0016912d;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_0016912d:
  map_dungeon(pdVar7,'\0','\0',TRUE);
  mark_chests(rom,'\x10');
  clear_all_flags();
  uVar9 = maps->index;
  pdVar7 = maps;
  while (uVar9 != '\0') {
    if (uVar9 == '\x16') goto LAB_0016916f;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_0016916f:
  map_dungeon(pdVar7,'\x06','\x05',FALSE);
  mark_chests(rom,'\x02');
  clear_all_flags();
  uVar9 = maps->index;
  pdVar7 = maps;
  while (uVar9 != '\0') {
    if (uVar9 == '\x16') goto LAB_001691b4;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_001691b4:
  map_dungeon(pdVar7,'\x06','\x05',TRUE);
  mark_chests(rom,' ');
  clear_all_flags();
  uVar9 = maps->index;
  pdVar7 = maps;
  while (uVar9 != '\0') {
    if (uVar9 == '\x18') goto LAB_001691fc;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_001691fc:
  map_dungeon(pdVar7,'\x06','\v',FALSE);
  mark_chests(rom,'\x04');
  clear_all_flags();
  uVar9 = maps->index;
  pdVar7 = maps;
  while (uVar9 != '\0') {
    if (uVar9 == '\x18') goto LAB_00169241;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_00169241:
  map_dungeon(pdVar7,'\x06','\v',TRUE);
  mark_chests(rom,'@');
  clear_all_flags();
  uVar9 = maps->index;
  pdVar7 = maps;
  while (uVar9 != '\0') {
    if (uVar9 == '\x06') goto LAB_00169289;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_00169289:
  map_dungeon(pdVar7,'\n','\x13',FALSE);
  mark_chests(rom,'\b');
  clear_all_flags();
  uVar9 = maps->index;
  pdVar7 = maps;
  while (uVar9 != '\0') {
    if (uVar9 == '\x06') goto LAB_001692ce;
    pdVar20 = pdVar7 + 1;
    pdVar7 = pdVar7 + 1;
    uVar9 = pdVar20->index;
  }
  pdVar7 = (dungeon_map *)0x0;
LAB_001692ce:
  map_dungeon(pdVar7,'\n','\x13',TRUE);
  mark_chests(rom,0x80);
  return;
}

Assistant:

void stair_shuffle(dw_rom *rom)
{

    stair_shuffle_init(rom);
    if (STAIR_SHUFFLE(rom)) {
        printf("Shuffling stairs...\n");
        do_shuffle(rom);
        code_patches(rom);
        write_back_warps(rom);
    }
    chest_paths(rom);

}